

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

int GetCoeffsAlt(VP8BitReader *br,VP8BandProbas **prob,int ctx,int *dq,int n,int16_t *out)

{
  VP8BandProbas *pVVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  VP8ProbaArray *p;
  long lVar6;
  
  p = prob[n]->probas_ + ctx;
  while( true ) {
    if (0xf < n) {
      return 0x10;
    }
    iVar2 = VP8GetBitAlt(br,(uint)(*p)[0]);
    if (iVar2 == 0) break;
    lVar5 = (long)n;
    lVar6 = lVar5 << 0x20;
    while( true ) {
      n = n + 1;
      iVar2 = VP8GetBitAlt(br,(uint)(*p)[1]);
      if (iVar2 != 0) break;
      p = (VP8ProbaArray *)prob[lVar5 + 1];
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x100000000;
      if (lVar5 == 0x10) {
        return 0x10;
      }
    }
    pVVar1 = prob[n];
    iVar3 = VP8GetBitAlt(br,(uint)(*p)[2]);
    lVar4 = 0xb;
    iVar2 = 1;
    if (iVar3 != 0) {
      iVar2 = GetLargeValue(br,*p);
      lVar4 = 0x16;
    }
    p = (VP8ProbaArray *)(pVVar1->probas_[0] + lVar4);
    iVar2 = VP8GetSigned(br,iVar2);
    out[""[lVar6 >> 0x20]] = (short)iVar2 * (short)dq[0 < lVar5];
  }
  return n;
}

Assistant:

static int GetCoeffsAlt(VP8BitReader* const br,
                        const VP8BandProbas* const prob[],
                        int ctx, const quant_t dq, int n, int16_t* out) {
  const uint8_t* p = prob[n]->probas_[ctx];
  for (; n < 16; ++n) {
    if (!VP8GetBitAlt(br, p[0], "coeffs")) {
      return n;  // previous coeff was last non-zero coeff
    }
    while (!VP8GetBitAlt(br, p[1], "coeffs")) {       // sequence of zero coeffs
      p = prob[++n]->probas_[0];
      if (n == 16) return 16;
    }
    {        // non zero coeff
      const VP8ProbaArray* const p_ctx = &prob[n + 1]->probas_[0];
      int v;
      if (!VP8GetBitAlt(br, p[2], "coeffs")) {
        v = 1;
        p = p_ctx[1];
      } else {
        v = GetLargeValue(br, p);
        p = p_ctx[2];
      }
      out[kZigzag[n]] = VP8GetSigned(br, v, "coeffs") * dq[n > 0];
    }
  }
  return 16;
}